

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O2

void mfascii(mFILE *mf)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 1;
  uVar3 = uVar2;
  for (; uVar2 < mf->size; uVar2 = uVar2 + 1) {
    pcVar1 = mf->data;
    if (pcVar1[uVar2] == '\n') {
      uVar3 = uVar3 - (pcVar1[uVar2 - 1] == '\r');
    }
    pcVar1[uVar3] = pcVar1[uVar2];
    uVar3 = uVar3 + 1;
  }
  mf->size = uVar3;
  mf->offset = 0;
  mf->flush_pos = 0;
  return;
}

Assistant:

void mfascii(mFILE *mf) {
    size_t p1, p2;

    for (p1 = p2 = 1; p1 < mf->size; p1++, p2++) {
	if (mf->data[p1] == '\n' && mf->data[p1-1] == '\r') {
	    p2--; /* delete the \r */
	}
	mf->data[p2] = mf->data[p1];
    }
    mf->size = p2;

    mf->offset = mf->flush_pos = 0;
}